

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

bson_type_t bson_iter_type(bson_iter_t *iter)

{
  uint8_t **ppuVar1;
  size_t *psVar2;
  byte bVar3;
  uint8_t uVar4;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  long lVar8;
  int64_t iVar9;
  bool bVar10;
  _Bool _Var11;
  uint uVar12;
  bson_type_t extraout_EAX;
  bson_type_t bVar13;
  int iVar14;
  void *pvVar15;
  undefined8 uVar16;
  long lVar17;
  size_t sVar18;
  ulong uVar19;
  char *pcVar20;
  code *pcVar21;
  bson_oid_t *pbVar22;
  char *__s;
  size_t nbytes;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint32_t uVar26;
  ulong *in_RCX;
  uint8_t *puVar27;
  uint uVar28;
  int32_t iVar29;
  uint *extraout_RDX;
  int *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  ulong *extraout_RDX_02;
  bson_type_t *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var30;
  bson_t *in_RSI;
  anon_union_24_17_78d57918_for_value *dst;
  bson_json_reader_cb num_bytes;
  bson_error_t *__s_00;
  uint8_t *puVar31;
  bson_t *pbVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  bool bVar36;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_560;
  uint32_t uStack_2a0;
  _Bool _Stack_299;
  bson_t *pbStack_298;
  uint32_t uStack_290;
  uint32_t uStack_28c;
  uint8_t *puStack_288;
  char *apcStack_280 [45];
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_type_cold_3();
LAB_00110bc7:
    bson_iter_type_cold_2();
  }
  else {
    if (iter->raw == (uint8_t *)0x0) goto LAB_00110bc7;
    if (iter->len != 0) {
      return (bson_type_t)iter->raw[iter->type];
    }
  }
  bson_iter_type_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    *(undefined1 *)in_RCX = 0;
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31 == (uint8_t *)0x0) {
      in_RSI->flags = 0;
      in_RSI->len = 0;
      *extraout_RDX = 0;
      bVar13 = BSON_TYPE_EOD;
      goto LAB_00110e9c;
    }
    uVar35 = *(uint *)&(((bson_json_reader_t *)iter)->producer).cb;
    uVar25 = (uint)(((bson_json_reader_t *)iter)->producer).bytes_read;
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4) = uVar25;
    *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb = uVar25;
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4) = uVar25 + 1;
    ppuVar1 = &(((bson_json_reader_t *)iter)->producer).buf;
    (((bson_json_reader_t *)iter)->producer).buf = (uint8_t *)0x0;
    (((bson_json_reader_t *)iter)->producer).buf_size = 0;
    uVar19 = (ulong)uVar25;
    do {
      iVar14 = (int)uVar19;
      uVar12 = iVar14 + 1;
      uVar19 = (ulong)uVar12;
      if (uVar35 <= uVar12) goto LAB_00110e8d;
    } while (puVar31[uVar12] != '\0');
    uVar33 = iVar14 + 2;
    *(uint *)&(((bson_json_reader_t *)iter)->producer).buf = uVar33;
    *(uint8_t **)in_RSI = puVar31 + (uVar25 + 1);
    puVar27 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar3 = puVar27[uVar25];
    *extraout_RDX = (uint)bVar3;
    uVar25 = uVar33;
    if (0x13 < bVar3) {
      if ((bVar3 == 0x7f) || (bVar3 == 0xff)) goto switchD_00110c4f_caseD_6;
      *(undefined1 *)in_RCX = 1;
      goto switchD_00110c4f_caseD_0;
    }
    uVar24 = iVar14 + 3;
    switch(bVar3) {
    case 0:
      break;
    default:
      uVar19 = (ulong)(iVar14 + 10);
      goto LAB_00110c54;
    case 2:
    case 0xd:
    case 0xe:
      uVar24 = iVar14 + 6;
      if (uVar24 < uVar35) {
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar24;
        uVar28 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if (uVar28 <= (uVar35 - uVar12) - 5) {
          uVar34 = uVar28 + uVar12 + 5;
          *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar34;
          if (uVar28 != 0) {
            if (uVar34 < uVar35) {
              if (puVar27[(ulong)(uVar28 - 1) + (ulong)uVar24] == '\0') goto LAB_00110c8a;
              uVar25 = uVar28 + uVar12 + 4;
            }
            goto LAB_00110e8a;
          }
        }
      }
      break;
    case 3:
    case 4:
      if ((uVar33 < uVar35 - 4) &&
         (uVar24 = *(uint *)(puVar27 + *(uint *)ppuVar1), uVar24 <= uVar35)) {
        if (~uVar12 + uVar35 < uVar24) goto LAB_00110e8a;
        uVar24 = uVar24 + uVar12 + 1;
        goto LAB_00110c87;
      }
      break;
    case 5:
      if (uVar33 < uVar35 - 4) {
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = iVar14 + 6U;
        uVar24 = iVar14 + 7;
        *(uint *)&(((bson_json_reader_t *)iter)->producer).buf_size = uVar24;
        uVar25 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if (~uVar12 + uVar35 <= uVar25) goto LAB_00110f00;
        if (puVar27[iVar14 + 6U] == '\x02') {
          uVar28 = uVar33;
          if ((uVar25 < 4) || (uVar28 = uVar24, *(int *)(puVar27 + uVar24) + 4U != uVar25)) {
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar28;
            bVar36 = true;
            bVar10 = false;
          }
          else {
            bVar36 = false;
            bVar10 = true;
          }
          if (bVar10) goto LAB_00110f84;
        }
        else {
LAB_00110f84:
          uVar25 = uVar12 + uVar25 + 6;
          uVar19 = (ulong)uVar25;
          *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar25;
          bVar36 = false;
        }
      }
      else {
LAB_00110f00:
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar33;
        bVar36 = true;
      }
      bVar13 = (bson_type_t)uVar19;
      if (bVar36) goto LAB_00110e8d;
      if (bVar36) goto LAB_00110e9c;
      goto LAB_00110c8a;
    case 6:
    case 10:
switchD_00110c4f_caseD_6:
      *(uint32_t *)ppuVar1 = 0xffffffff;
      uVar24 = uVar33;
      goto LAB_00110c87;
    case 7:
      uVar19 = (ulong)(iVar14 + 0xe);
      goto LAB_00110c54;
    case 8:
      uVar19 = (ulong)*(uint *)ppuVar1;
      if ((*(uint *)ppuVar1 < uVar35) && (puVar27[uVar19] < 2)) goto LAB_00110c87;
      break;
    case 0xb:
      bVar36 = uVar33 < uVar35;
      if (bVar36) {
        if (puVar31[uVar33] != '\0') {
          uVar19 = (ulong)uVar24;
          do {
            bVar36 = (uint)uVar19 < uVar35;
            uVar25 = uVar35;
            if (!bVar36) goto LAB_00110f1f;
            uVar33 = uVar33 + 1;
            puVar27 = puVar31 + uVar19;
            uVar19 = uVar19 + 1;
          } while (*puVar27 != '\0');
        }
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar33 + 1;
        uVar25 = uVar33 + 1;
      }
LAB_00110f1f:
      uVar33 = uVar25;
      if ((bVar36) && (uVar25 < uVar35)) {
        do {
          if (puVar31[uVar25] == '\0') {
            *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar25 + 1;
            uVar19 = CONCAT71((uint7)(uint3)(uVar25 + 1 >> 8),1);
            uVar33 = uVar25;
            goto LAB_00110f45;
          }
          uVar25 = uVar25 + 1;
          uVar33 = uVar35;
        } while (uVar35 != uVar25);
      }
      *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
           (uint32_t)(((bson_json_reader_t *)iter)->producer).bytes_read;
      uVar19 = 0;
LAB_00110f45:
      if ((char)uVar19 != '\0') goto LAB_00110c8a;
      goto LAB_00110e8d;
    case 0xc:
      if (uVar33 < uVar35 - 4) {
        *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = iVar14 + 6;
        uVar24 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if (((ulong)uVar24 != 0) && (uVar24 <= (uVar35 - uVar12) - 5)) {
          if (puVar27[(ulong)uVar24 + 3 + (ulong)uVar33] != '\0') {
            uVar25 = uVar24 + uVar12 + 4;
            goto LAB_00110e8a;
          }
          *(uint *)&(((bson_json_reader_t *)iter)->producer).buf_size = uVar24 + uVar12 + 5;
          uVar24 = uVar24 + uVar12 + 0x11;
          goto LAB_00110c87;
        }
      }
      break;
    case 0xf:
      if (uVar35 < 0x13) break;
      if (uVar33 < uVar35 - 0xe) {
        uVar28 = iVar14 + 6;
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar28;
        *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf_size = iVar14 + 10;
        uVar24 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if ((0xd < uVar24) && (uVar24 < ~uVar12 + uVar35)) {
          uVar24 = uVar24 + uVar12 + 1;
          *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar24;
          if ((uVar24 < uVar35) && (uVar34 = *(uint *)(puVar27 + uVar28), uVar34 != 0)) {
            if ((uVar34 < (uVar35 - uVar12) - 9) &&
               (uVar25 = uVar28, uVar34 + uVar12 + 0xd < uVar24)) {
              uVar25 = uVar34 + uVar12 + 9;
              *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4) = uVar25;
              uVar12 = uVar12 + uVar34 + *(int *)(puVar27 + uVar25) + 9;
              uVar19 = (ulong)uVar12;
              if (uVar24 == uVar12) goto LAB_00110c8a;
            }
            goto LAB_00110e8a;
          }
        }
        break;
      }
      goto LAB_00110e8a;
    case 0x10:
      uVar19 = (ulong)(iVar14 + 6);
      goto LAB_00110c54;
    case 0x13:
      uVar19 = (ulong)(iVar14 + 0x12);
LAB_00110c54:
      uVar24 = (uint)uVar19;
LAB_00110c87:
      *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar24;
LAB_00110c8a:
      uVar25 = uVar33;
      if ((uint)(((bson_json_reader_t *)iter)->producer).bytes_read < uVar35) {
        *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = 0;
        bVar13 = (bson_type_t)CONCAT71((int7)(uVar19 >> 8),1);
        goto LAB_00110e9c;
      }
      goto LAB_00110e8a;
    }
switchD_00110c4f_caseD_0:
LAB_00110e8a:
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar25;
LAB_00110e8d:
    (((bson_json_reader_t *)iter)->producer).data = (uint8_t *)0x0;
    bVar13 = BSON_TYPE_EOD;
    *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).cb = 0;
    *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).bytes_read = 0;
LAB_00110e9c:
    return bVar13 & 0xffffff01;
  }
  _bson_iter_next_internal_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_binary_cold_2();
  }
  else if (extraout_RDX_00 != (int *)0x0 || in_RCX == (ulong *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x05') {
      uVar35 = (uint)puVar31[*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)]
      ;
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags =
             (uint)puVar31[*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)];
      }
      if (in_RCX != (ulong *)0x0) {
        iVar14 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        *extraout_RDX_00 = iVar14;
        puVar31 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar31;
        if (in_RSI != (bson_t *)0x0) {
          uVar35 = in_RSI->flags;
        }
        if (uVar35 == 2) {
          *extraout_RDX_00 = iVar14 + -4;
          *in_RCX = (ulong)(puVar31 + 4);
        }
      }
    }
    else {
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = 0;
      }
      if (extraout_RDX_00 != (int *)0x0) {
        *extraout_RDX_00 = 0;
      }
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
    }
    return extraout_EAX;
  }
  bson_iter_binary_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\b') {
      return BSON_TYPE_EOD;
    }
    return (bson_type_t)
           CONCAT71((int7)((ulong)puVar31 >> 8),
                    puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0');
  }
  bson_iter_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar35 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
    uVar4 = puVar31[uVar35];
    bVar13 = (bson_type_t)CONCAT71((uint7)(uint3)(uVar35 >> 8),1);
    switch(uVar4) {
    case '\x01':
      return -(uint)(*(double *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
                    != 0.0) & BSON_TYPE_DOUBLE;
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\a':
    case '\t':
      return bVar13;
    case '\x06':
    case '\n':
      return BSON_TYPE_EOD;
    case '\b':
      uVar19 = (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      bVar36 = puVar31[uVar19] == '\0';
      break;
    default:
      if (uVar4 == '\x10') {
        uVar19 = (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
        bVar36 = *(int *)(puVar31 + uVar19) == 0;
      }
      else {
        if (uVar4 != '\x12') {
          return bVar13;
        }
        uVar19 = (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
        bVar36 = *(long *)(puVar31 + uVar19) == 0;
      }
    }
    return (bson_type_t)CONCAT71((int7)(uVar19 >> 8),!bVar36);
  }
  bson_iter_as_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    return (bson_type_t)(((bson_json_reader_t *)iter)->producer).data;
  }
  bson_iter_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x12') {
      return BSON_TYPE_EOD;
    }
    return (bson_type_t)
           *(undefined8 *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
  }
  bson_iter_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar13 = BSON_TYPE_EOD;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      bVar13 = *(bson_type_t *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    return bVar13;
  }
  bson_iter_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar3 = puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    bVar13 = (bson_type_t)puVar31;
    if (bVar3 < 0x10) {
      if (bVar3 == 1) {
        return bVar13;
      }
      if ((bVar3 == 8) && (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0'))
      {
        return bVar13;
      }
    }
    else if ((bVar3 != 0x10) && (bVar3 == 0x12)) {
      return bVar13;
    }
    return bVar13;
  }
  bson_iter_as_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar3 = puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    bVar13 = BSON_TYPE_EOD;
    if (bVar3 < 0x10) {
      if (bVar3 == 1) {
        return (bson_type_t)
               (long)*(double *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      if (bVar3 == 8) {
        return (bson_type_t)
               (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0');
      }
    }
    else if (bVar3 == 0x10) {
      bVar13 = *(bson_type_t *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else if (bVar3 == 0x12) {
      return (bson_type_t)
             *(undefined8 *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    return bVar13;
  }
  bson_iter_as_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar4 = puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    if (uVar4 == '\x13') {
      lVar17 = *(long *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      lVar8 = *(long *)((long)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8
                       );
      in_RSI->flags = (int)lVar17;
      in_RSI->len = (int)((ulong)lVar17 >> 0x20);
      *(long *)in_RSI->padding = lVar8;
    }
    return (bson_type_t)CONCAT71((int7)((ulong)puVar31 >> 8),uVar4 == '\x13');
  }
  bson_iter_decimal128_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\a') {
      return BSON_TYPE_EOD;
    }
    return (int)puVar31 + *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf;
  }
  bson_iter_oid_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\v') {
      bVar13 = *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf + (int)puVar31;
      puVar31 = puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      bVar13 = BSON_TYPE_EOD;
      puVar31 = (uint8_t *)0x0;
    }
    if (in_RSI != (bson_t *)0x0) {
      *(uint8_t **)in_RSI = puVar31;
    }
    return bVar13;
  }
  bson_iter_regex_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x02') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      return BSON_TYPE_EOD;
    }
    if (in_RSI != (bson_t *)0x0) {
      iVar14 = 1;
      if (1 < *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar14 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      in_RSI->flags = iVar14 - 1;
    }
    return (int)puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      iVar14 = 1;
      if (1 < *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar14 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar35 = iVar14 - 1;
      puVar31 = puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      uVar35 = 0;
      puVar31 = (uint8_t *)0x0;
    }
    if (puVar31 == (uint8_t *)0x0) {
      pvVar15 = (void *)0x0;
    }
    else {
      pvVar15 = bson_malloc0((ulong)(uVar35 + 1));
      memcpy(pvVar15,puVar31,(ulong)uVar35);
      *(undefined1 *)((long)pvVar15 + (ulong)uVar35) = 0;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar35;
    }
    return (bson_type_t)pvVar15;
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\r') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      return BSON_TYPE_EOD;
    }
    if (in_RSI != (bson_t *)0x0) {
      iVar14 = 1;
      if (1 < *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar14 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      in_RSI->flags = iVar14 - 1;
    }
    return (int)puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      if (extraout_RDX_01 != (undefined4 *)0x0) {
        *extraout_RDX_01 = 0;
      }
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = 0;
      }
      return BSON_TYPE_EOD;
    }
    if (in_RSI == (bson_t *)0x0) {
LAB_001113bb:
      *extraout_RDX_01 =
           *(undefined4 *)
            (puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      *in_RCX = (ulong)(puVar31 +
                       *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      return (uint32_t)(((bson_json_reader_t *)iter)->producer).buf_size +
             (int)(((bson_json_reader_t *)iter)->producer).data;
    }
    if (*(int *)(puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
        != 0) {
      in_RSI->flags =
           *(int *)(puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
      goto LAB_001113bb;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_02 != (ulong *)0x0) {
      *extraout_RDX_02 = 0;
    }
    if (in_RCX != (ulong *)0x0) {
      *in_RCX = 0;
    }
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if (in_RSI != (bson_t *)0x0) {
        uVar35 = *(uint *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        puVar31 = (uint8_t *)(ulong)uVar35;
        in_RSI->flags = uVar35;
        if (uVar35 != 0) {
          puVar31 = (uint8_t *)(ulong)(uVar35 - 1);
          in_RSI->flags = uVar35 - 1;
        }
      }
      if (extraout_RDX_02 != (ulong *)0x0) {
        puVar31 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
        *extraout_RDX_02 = (ulong)puVar31;
      }
      if (in_RCX != (ulong *)0x0) {
        puVar31 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar31;
      }
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      bVar13 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) + (int)puVar31
      ;
      iVar14 = 1;
      if (1 < *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar14 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar26 = iVar14 - 1;
    }
    else {
      bVar13 = BSON_TYPE_EOD;
      uVar26 = 0;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar26;
    }
    return bVar13;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return BSON_TYPE_EOD;
    }
    return (bson_type_t)
           *(undefined8 *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return BSON_TYPE_EOD;
    }
    return (bson_type_t)
           (*(ulong *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) / 1000);
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar26 = 0;
    uVar16 = 0;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      uVar16 = *(undefined8 *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar26 = (uint32_t)((ulong)uVar16 >> 0x20);
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar26;
    }
    if (extraout_RDX_03 != (bson_type_t *)0x0) {
      *extraout_RDX_03 = (bson_type_t)uVar16;
    }
    return (bson_type_t)uVar16;
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      in_RSI->flags = 0;
      in_RSI->len = 0;
      in_RSI->padding[0] = '\0';
      in_RSI->padding[1] = '\0';
      in_RSI->padding[2] = '\0';
      in_RSI->padding[3] = '\0';
      in_RSI->padding[4] = '\0';
      in_RSI->padding[5] = '\0';
      in_RSI->padding[6] = '\0';
      in_RSI->padding[7] = '\0';
      return (bson_type_t)puVar31;
    }
    lVar17 = *(long *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    *(long *)in_RSI = lVar17 / 1000;
    lVar17 = (lVar17 % 1000) * 1000;
    *(long *)in_RSI->padding = lVar17;
    return (bson_type_t)lVar17;
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if (in_RSI != (bson_t *)0x0) {
    _Var11 = _bson_iter_next_internal(iter,(char **)&puStack_288,&uStack_290,&_Stack_299);
    if (_Var11) {
      do {
        puVar31 = puStack_288;
        if (*puStack_288 != '\0') {
          sVar18 = strlen((char *)puStack_288);
          _Var11 = bson_utf8_validate((char *)puVar31,sVar18,false);
          if (!_Var11) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)in_RSI != (code *)0x0) &&
           (uVar19 = (**(code **)in_RSI)(iter,puVar31,extraout_RDX_04), (char)uVar19 != '\0'))
        goto LAB_00111b92;
        switch(uStack_290) {
        case 1:
          pcVar21 = *(code **)(in_RSI->padding + 0x10);
          if (pcVar21 == (code *)0x0) break;
          dVar7 = bson_iter_double(iter);
          uVar19 = (*pcVar21)(SUB84(dVar7,0),iter,puVar31,extraout_RDX_04);
          goto LAB_00111ad6;
        case 2:
          pcVar20 = bson_iter_utf8(iter,(uint32_t *)apcStack_280);
          _Var11 = bson_utf8_validate(pcVar20,(ulong)apcStack_280[0] & 0xffffffff,true);
          if (!_Var11) {
LAB_00111b8c:
            uVar35 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            uVar19 = (ulong)uVar35;
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar35;
            goto LAB_00111b92;
          }
          pcVar21 = *(code **)(in_RSI->padding + 0x18);
          goto LAB_001119f8;
        case 3:
          pbStack_298 = (bson_t *)0x0;
          uStack_2a0 = 0;
          bson_iter_document(iter,&uStack_2a0,(uint8_t **)&pbStack_298);
          _Var11 = bson_init_static((bson_t *)apcStack_280,(uint8_t *)pbStack_298,(ulong)uStack_2a0)
          ;
          if (_Var11) {
            pcVar21 = *(code **)(in_RSI->padding + 0x20);
            goto LAB_00111a42;
          }
          break;
        case 4:
          pbStack_298 = (bson_t *)0x0;
          uStack_2a0 = 0;
          bson_iter_array(iter,&uStack_2a0,(uint8_t **)&pbStack_298);
          _Var11 = bson_init_static((bson_t *)apcStack_280,(uint8_t *)pbStack_298,(ulong)uStack_2a0)
          ;
          if (_Var11) {
            pcVar21 = *(code **)(in_RSI->padding + 0x28);
            goto LAB_00111a42;
          }
          break;
        case 5:
          apcStack_280[0] = (char *)0x0;
          pbStack_298 = (bson_t *)((ulong)pbStack_298 & 0xffffffff00000000);
          uStack_2a0 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_298,&uStack_2a0,(uint8_t **)apcStack_280)
          ;
          if (*(code **)(in_RSI->padding + 0x30) != (code *)0x0) {
            uVar19 = (**(code **)(in_RSI->padding + 0x30))
                               (iter,puVar31,(ulong)pbStack_298 & 0xffffffff,uStack_2a0,
                                apcStack_280[0],extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        case 6:
          pcVar21 = *(code **)(in_RSI->padding + 0x38);
          goto LAB_001119ae;
        case 7:
          pcVar21 = *(code **)(in_RSI->padding + 0x40);
          if (pcVar21 != (code *)0x0) {
            pbVar22 = bson_iter_oid(iter);
LAB_00111ac7:
            uVar19 = (*pcVar21)(iter,puVar31,pbVar22,extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        case 8:
          pcVar21 = *(code **)(in_RSI->padding + 0x48);
          if (pcVar21 != (code *)0x0) {
            _Var11 = bson_iter_bool(iter);
            uVar35 = (uint)_Var11;
LAB_00111934:
            uVar19 = (*pcVar21)(iter,puVar31,uVar35,extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        case 9:
          pcVar21 = *(code **)(in_RSI->padding + 0x50);
          if (pcVar21 != (code *)0x0) {
            pbVar22 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_00111ac7;
          }
          break;
        case 10:
          pcVar21 = *(code **)(in_RSI->padding + 0x58);
LAB_001119ae:
          if (pcVar21 == (code *)0x0) break;
LAB_001119bd:
          uVar19 = (*pcVar21)(iter,puVar31,extraout_RDX_04);
          goto LAB_00111ad6;
        case 0xb:
          apcStack_280[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_280);
          sVar18 = strlen(__s);
          _Var11 = bson_utf8_validate(__s,sVar18,true);
          if (!_Var11) goto LAB_00111b8c;
          pcVar21 = *(code **)(in_RSI->padding + 0x60);
          pcVar20 = apcStack_280[0];
          if (pcVar21 == (code *)0x0) break;
          goto LAB_00111aaf;
        case 0xc:
          uStack_2a0 = 0;
          apcStack_280[0] = (char *)0x0;
          pbStack_298 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_2a0,apcStack_280,(bson_oid_t **)&pbStack_298);
          _Var11 = bson_utf8_validate(apcStack_280[0],(ulong)uStack_2a0,true);
          if (!_Var11) goto LAB_00111b8c;
          pcVar21 = *(code **)(in_RSI->padding + 0x68);
          pcVar20 = apcStack_280[0];
          pbVar32 = pbStack_298;
          if (pcVar21 != (code *)0x0) {
LAB_001117cc:
            uVar19 = (*pcVar21)(iter,puVar31,uStack_2a0,pcVar20,pbVar32,extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        case 0xd:
          pcVar20 = bson_iter_code(iter,(uint32_t *)apcStack_280);
          _Var11 = bson_utf8_validate(pcVar20,(ulong)apcStack_280[0] & 0xffffffff,true);
          if (!_Var11) goto LAB_00111b8c;
          pcVar21 = *(code **)(in_RSI->padding + 0x70);
          goto LAB_001119f8;
        case 0xe:
          pcVar20 = bson_iter_symbol(iter,(uint32_t *)apcStack_280);
          _Var11 = bson_utf8_validate(pcVar20,(ulong)apcStack_280[0] & 0xffffffff,true);
          if (!_Var11) goto LAB_00111b8c;
          pcVar21 = *(code **)(in_RSI + 1);
LAB_001119f8:
          if (pcVar21 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_280[0] & 0xffffffff);
LAB_00111aaf:
            uVar19 = (*pcVar21)(iter,puVar31,__s,pcVar20,extraout_RDX_04);
LAB_00111ad6:
            if ((char)uVar19 != '\0') goto LAB_00111b92;
          }
          break;
        case 0xf:
          uStack_2a0 = 0;
          pbStack_298 = (bson_t *)0x0;
          uStack_28c = 0;
          pcVar20 = bson_iter_codewscope(iter,&uStack_2a0,&uStack_28c,(uint8_t **)&pbStack_298);
          _Var11 = bson_utf8_validate(pcVar20,(ulong)uStack_2a0,true);
          if (!_Var11) goto LAB_00111b8c;
          _Var11 = bson_init_static((bson_t *)apcStack_280,(uint8_t *)pbStack_298,(ulong)uStack_28c)
          ;
          if ((_Var11) && (pcVar21 = *(code **)in_RSI[1].padding, pcVar21 != (code *)0x0)) {
            pbVar32 = (bson_t *)apcStack_280;
            goto LAB_001117cc;
          }
          break;
        case 0x10:
          pcVar21 = *(code **)(in_RSI[1].padding + 8);
          if (pcVar21 != (code *)0x0) {
            uVar35 = bson_iter_int32(iter);
            goto LAB_00111934;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_280,(uint32_t *)&pbStack_298);
          if (*(code **)(in_RSI[1].padding + 0x10) != (code *)0x0) {
            uVar19 = (**(code **)(in_RSI[1].padding + 0x10))
                               (iter,puVar31,(ulong)apcStack_280[0] & 0xffffffff,
                                (ulong)pbStack_298 & 0xffffffff,extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        case 0x12:
          pcVar21 = *(code **)(in_RSI[1].padding + 0x18);
          if (pcVar21 != (code *)0x0) {
            pbVar22 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_00111ac7;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_280);
          pcVar21 = *(code **)(in_RSI[1].padding + 0x38);
LAB_00111a42:
          if (pcVar21 != (code *)0x0) {
            uVar19 = (*pcVar21)(iter,puVar31,(bson_t *)apcStack_280,extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        default:
          if (uStack_290 == 0x7f) {
            pcVar21 = *(code **)(in_RSI[1].padding + 0x20);
          }
          else {
            if (uStack_290 != 0xff) break;
            pcVar21 = *(code **)(in_RSI[1].padding + 0x28);
          }
          if (pcVar21 == (code *)0x0) break;
          puVar31 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_001119bd;
        }
        if ((*(code **)in_RSI->padding != (code *)0x0) &&
           (uVar19 = (**(code **)in_RSI->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_04), (char)uVar19 != '\0')) {
LAB_00111b92:
          return (bson_type_t)CONCAT71((int7)(uVar19 >> 8),1);
        }
        _Var11 = _bson_iter_next_internal(iter,(char **)&puStack_288,&uStack_290,&_Stack_299);
      } while (_Var11);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_299 == true) && (*(long *)(in_RSI[1].padding + 0x30) != 0)) {
        sVar18 = strlen((char *)puStack_288);
        _Var11 = bson_utf8_validate((char *)puStack_288,sVar18,false);
        if (_Var11) {
          (**(code **)(in_RSI[1].padding + 0x30))(iter,puStack_288,uStack_290,extraout_RDX_04);
          return BSON_TYPE_EOD;
        }
      }
      if (*(code **)(in_RSI->padding + 8) != (code *)0x0) {
        (**(code **)(in_RSI->padding + 8))(iter,extraout_RDX_04);
      }
    }
    return BSON_TYPE_EOD;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)in_RSI;
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)in_RSI;
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(bson_t **)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = in_RSI;
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar31[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar35 = *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      lVar17 = *(long *)in_RSI->padding;
      *(long *)(puVar31 + uVar35) = *(long *)in_RSI;
      *(long *)((long)(puVar31 + uVar35) + 8) = lVar17;
    }
    return (bson_type_t)puVar31;
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if (in_RSI != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = in_RSI;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_560;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      bVar13 = BSON_TYPE_EOD;
      while( true ) {
        sVar5 = ((bson_json_reader_t *)iter)->json->pos;
        nbytes = (((bson_json_reader_t *)iter)->producer).bytes_read;
        if (nbytes == 0) {
          nbytes = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)nbytes < 0) {
          bVar13 = ~BSON_TYPE_EOD;
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
          }
          goto LAB_00111fff;
        }
        if (nbytes == 0) goto LAB_00111fff;
        (((bson_json_reader_t *)iter)->producer).bytes_read = nbytes;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,nbytes);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar31 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar31,puVar31 + ((bson_json_reader_t *)iter)->advance,
                  nbytes - ((bson_json_reader_t *)iter)->advance);
          psVar2 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar2 = *psVar2 - ((bson_json_reader_t *)iter)->advance;
          bVar13 = BSON_TYPE_DOUBLE;
          goto LAB_00111fff;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) break;
        uVar19 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar19 != 0xffffffffffffffff) &&
           (uVar6 = ((bson_json_reader_t *)iter)->json->pos, uVar23 = uVar6 - uVar19,
           uVar19 <= uVar6 && uVar23 != 0)) {
          if (uVar23 < nbytes) {
            nbytes = uVar23;
          }
          lVar17 = uVar19 - sVar5;
          if (lVar17 < 1) {
            lVar17 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar17,nbytes);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        bVar13 = BSON_TYPE_DOUBLE;
      }
      bVar13 = ~BSON_TYPE_EOD;
LAB_00111fff:
      if ((bVar13 == BSON_TYPE_DOUBLE) &&
         ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE)) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        bVar13 = ~BSON_TYPE_EOD;
      }
      return bVar13;
    }
    bson_json_reader_read_cold_1();
    p_Var30 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var30 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
    }
    else if ((((bson_json_reader_t *)iter)->producer).cb < p_Var30 + __n + 1) {
      uVar19 = (ulong)(p_Var30 + __n) >> 1 | (ulong)(p_Var30 + __n);
      uVar19 = uVar19 >> 2 | uVar19;
      uVar19 = uVar19 >> 4 | uVar19;
      uVar19 = uVar19 >> 8 | uVar19;
      uVar19 = uVar19 >> 0x10 | uVar19;
      num_bytes = (bson_json_reader_cb)((uVar19 >> 0x20 | uVar19) + 1);
      (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
      pvVar15 = bson_realloc((((bson_json_reader_t *)iter)->producer).data,(size_t)num_bytes);
      (((bson_json_reader_t *)iter)->producer).data = pvVar15;
    }
    memcpy((((bson_json_reader_t *)iter)->producer).dcb +
           (long)(((bson_json_reader_t *)iter)->producer).data,in_RSI,__n);
    p_Var30 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var30;
    pvVar15 = (((bson_json_reader_t *)iter)->producer).data;
    p_Var30[(long)pvVar15] = (_func_void_void_ptr)0x0;
    return (bson_type_t)pvVar15;
  }
  puVar31 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar35 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar3 = puVar31[uVar35];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar3
  ;
  switch(bVar3) {
  case 1:
    dVar7 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar7;
    break;
  case 2:
    pcVar20 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar22 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111da5;
  case 8:
    _Var11 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var11;
    break;
  case 9:
    pcVar20 = (char *)bson_iter_date_time(iter);
    goto LAB_00111e4c;
  case 0xb:
    pcVar20 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar22 = (bson_oid_t *)0x0;
    if (puVar31[uVar35] == '\f') {
      uVar35 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar14 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar14 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar14;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar31 + uVar35);
      pbVar22 = (bson_oid_t *)(puVar31 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111da5:
    bson_oid_copy(pbVar22,&dst->v_oid);
    break;
  case 0xd:
    if (puVar31[uVar35] == '\r') {
      iVar14 = 1;
      if (1 < *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar14 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar35 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar14 + -1;
      puVar27 = puVar31 + uVar35;
    }
    else {
      *(undefined4 *)&((bson_json_reader_t *)iter)->field_0x40 = 0;
      puVar27 = (uint8_t *)0x0;
    }
    goto LAB_00111e59;
  case 0xe:
    if (puVar31[uVar35] == '\x0e') {
      puVar27 = puVar31 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar14 = 1;
      if (1 < *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar14 = *(int *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar14 = iVar14 + -1;
    }
    else {
      puVar27 = (uint8_t *)0x0;
      iVar14 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar14;
LAB_00111e59:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar27;
    break;
  case 0xf:
    pcVar20 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0x10:
    iVar29 = 0;
    if (puVar31[uVar35] == '\x10') {
      iVar29 = *(int32_t *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar29;
    break;
  case 0x11:
    iVar29 = 0;
    uVar16 = 0;
    if (puVar31[uVar35] == '\x11') {
      uVar16 = *(undefined8 *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar29 = (int32_t)((ulong)uVar16 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar29;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar16;
    break;
  case 0x12:
    if (puVar31[uVar35] == '\x12') {
      pcVar20 = *(char **)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar20 = (char *)0x0;
    }
LAB_00111e4c:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar20;
    break;
  case 0x13:
    if (puVar31[uVar35] == '\x13') {
      iVar9 = *(int64_t *)
               ((long)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar31 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
    }
    break;
  default:
    if ((bVar3 != BSON_TYPE_MAXKEY) && (bVar3 != 0xff)) {
      return BSON_TYPE_EOD;
    }
  }
  return (int)iter + 0x30;
}

Assistant:

bson_type_t
bson_iter_type (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (iter->raw);
   BSON_ASSERT (iter->len);

   return bson_iter_type_unsafe (iter);
}